

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpkdecoder.c
# Opt level: O0

LPStatus XPKDecoder_RGBAToPNG(uint8_t *rgba,XPKEntry *entry,char *path)

{
  int iVar1;
  int status;
  char *path_local;
  XPKEntry *entry_local;
  uint8_t *rgba_local;
  
  iVar1 = stbi_write_png(path,(uint)entry->width,(uint)entry->height,4,rgba,(uint)entry->width << 2)
  ;
  if (iVar1 == 0) {
    LPWarn("xpk","stbi_write_png() failed: %d",0);
  }
  rgba_local._4_4_ = (LPStatus)(iVar1 == 0);
  return rgba_local._4_4_;
}

Assistant:

LPStatus
XPKDecoder_RGBAToPNG(const uint8_t *rgba, const XPKEntry *entry, const char *path)
{
	int status = stbi_write_png(path, entry->width, entry->height, 4, rgba, entry->width*4);
	if (status) {
		return LUNAPURPURA_OK;
	} else {
		LPWarn(LP_SUBSYSTEM_XPK, "stbi_write_png() failed: %d", status);
		return LUNAPURPURA_ERROR;
	}
}